

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O2

void __thiscall
ExprVisitorTest_VisitStringLiteral_Test::TestBody(ExprVisitorTest_VisitStringLiteral_Test *this)

{
  bool bVar1;
  StringLiteral value;
  MockSpec<TestResult_(mp::StringLiteral)> *this_00;
  char *pcVar2;
  StrictMock<MockVisitor> *this_01;
  StringRef value_00;
  BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> local_50;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  
  value_00.size_ = 3;
  value_00.data_ = "foo";
  value = mp::BasicExprFactory<std::allocator<char>_>::MakeStringLiteral
                    (&(this->super_ExprVisitorTest).factory_,value_00);
  this_01 = &(this->super_ExprVisitorTest).visitor_;
  testing::Matcher<mp::StringLiteral>::Matcher
            ((Matcher<mp::StringLiteral> *)&gtest_expected_message,value);
  this_00 = MockVisitor::gmock_VisitStringLiteral
                      (&this_01->super_MockVisitor,
                       (Matcher<mp::StringLiteral> *)&gtest_expected_message);
  pcVar2 = "visitor_";
  testing::internal::MockSpec<TestResult_(mp::StringLiteral)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x21a,"visitor_","VisitStringLiteral(e)");
  testing::internal::MatcherBase<mp::StringLiteral>::~MatcherBase
            ((MatcherBase<mp::StringLiteral> *)&gtest_expected_message);
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)this_01,
             (Expr)value.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.
                   impl_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    local_50._vptr_BasicExprVisitor =
         (_func_int **)
         mp::expr::str(*(Kind *)value.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.
                                super_ExprBase.impl_);
    fmt::format<char_const*>
              (&gtest_expected_message,(fmt *)"unsupported: {}",(CStringRef)&local_50,
               (char **)pcVar2);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::StrictMock<NullVisitor>::StrictMock((StrictMock<NullVisitor> *)&local_50);
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                (&local_50,
                 (Expr)value.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.
                       impl_);
      testing::StrictMock<NullVisitor>::~StrictMock((StrictMock<NullVisitor> *)&local_50);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [127])
               "Expected: StrictMock<NullVisitor>().Visit(base) throws an exception of type mp::UnsupportedError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x21d,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_50,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitStringLiteral) {
  auto e = factory_.MakeStringLiteral("foo");
  EXPECT_CALL(visitor_, VisitStringLiteral(e));
  mp::Expr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED(base);
}